

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

ggwave_Instance ggwave_init(ggwave_Parameters parameters)

{
  GGWave *this;
  long lVar1;
  long *plVar2;
  Parameters local_44;
  
  plVar2 = &(anonymous_namespace)::g_instances;
  lVar1 = 0;
  do {
    if (lVar1 == 4) {
      lVar1 = -1;
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        fprintf((anonymous_namespace)::g_fptr,
                "Failed to create GGWave instance - reached maximum number of instances (%d)\n",4);
      }
LAB_00105d52:
      return (ggwave_Instance)lVar1;
    }
    if (*plVar2 == 0) {
      this = (GGWave *)operator_new(0x5b8);
      local_44.payloadLength = parameters.payloadLength;
      local_44.sampleRateInp = parameters.sampleRateInp;
      local_44.sampleRateOut = parameters.sampleRateOut;
      local_44.sampleRate = parameters.sampleRate;
      local_44.samplesPerFrame = parameters.samplesPerFrame;
      local_44.soundMarkerThreshold = parameters.soundMarkerThreshold;
      local_44.sampleFormatInp = parameters.sampleFormatInp;
      local_44.sampleFormatOut = parameters.sampleFormatOut;
      local_44.operatingMode = parameters.operatingMode;
      GGWave::GGWave(this,&local_44);
      *plVar2 = (long)this;
      goto LAB_00105d52;
    }
    lVar1 = lVar1 + 1;
    plVar2 = plVar2 + 1;
  } while( true );
}

Assistant:

ggwave_Instance ggwave_init(ggwave_Parameters parameters) {
    for (ggwave_Instance id = 0; id < GGWAVE_MAX_INSTANCES; ++id) {
        if (g_instances[id] == nullptr) {
            g_instances[id] = new GGWave({
                parameters.payloadLength,
                parameters.sampleRateInp,
                parameters.sampleRateOut,
                parameters.sampleRate,
                parameters.samplesPerFrame,
                parameters.soundMarkerThreshold,
                parameters.sampleFormatInp,
                parameters.sampleFormatOut,
                parameters.operatingMode});

            return id;
        }
    }

    ggprintf("Failed to create GGWave instance - reached maximum number of instances (%d)\n", GGWAVE_MAX_INSTANCES);

    return -1;
}